

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c
# Opt level: O0

int uv_thread_setaffinity(uv_thread_t *tid,char *cpumask,char *oldmask,size_t mask_size)

{
  int iVar1;
  ulong uVar2;
  size_t __cpu;
  undefined1 local_b8 [4];
  int cpumasksize;
  cpu_set_t cpuset;
  int r;
  int i;
  size_t mask_size_local;
  char *oldmask_local;
  char *cpumask_local;
  uv_thread_t *tid_local;
  
  iVar1 = uv_cpumask_size();
  tid_local._4_4_ = iVar1;
  if (-1 < iVar1) {
    if (mask_size < (ulong)(long)iVar1) {
      tid_local._4_4_ = -0x16;
    }
    else if ((oldmask == (char *)0x0) ||
            (cpuset.__bits[0xf]._0_4_ = uv_thread_getaffinity(tid,oldmask,mask_size),
            tid_local._4_4_ = (int)cpuset.__bits[0xf], -1 < (int)cpuset.__bits[0xf])) {
      memset(local_b8,0,0x80);
      for (cpuset.__bits[0xf]._4_4_ = 0; cpuset.__bits[0xf]._4_4_ < iVar1;
          cpuset.__bits[0xf]._4_4_ = cpuset.__bits[0xf]._4_4_ + 1) {
        if ((cpumask[cpuset.__bits[0xf]._4_4_] != '\0') &&
           ((ulong)(long)cpuset.__bits[0xf]._4_4_ >> 3 < 0x80)) {
          uVar2 = (ulong)(long)cpuset.__bits[0xf]._4_4_ >> 6;
          cpuset.__bits[uVar2 - 1] =
               1L << ((byte)cpuset.__bits[0xf]._4_4_ & 0x3f) | cpuset.__bits[uVar2 - 1];
        }
      }
      iVar1 = pthread_setaffinity_np(*tid,0x80,(cpu_set_t *)local_b8);
      tid_local._4_4_ = -iVar1;
    }
  }
  return tid_local._4_4_;
}

Assistant:

int uv_thread_setaffinity(uv_thread_t* tid,
                          char* cpumask,
                          char* oldmask,
                          size_t mask_size) {
  int i;
  int r;
  uv__cpu_set_t cpuset;
  int cpumasksize;

  cpumasksize = uv_cpumask_size();
  if (cpumasksize < 0)
    return cpumasksize;
  if (mask_size < (size_t)cpumasksize)
    return UV_EINVAL;

  if (oldmask != NULL) {
    r = uv_thread_getaffinity(tid, oldmask, mask_size);
    if (r < 0)
      return r;
  }

  CPU_ZERO(&cpuset);
  for (i = 0; i < cpumasksize; i++)
    if (cpumask[i])
      CPU_SET(i, &cpuset);

#if defined(__ANDROID__)
  if (sched_setaffinity(pthread_gettid_np(*tid), sizeof(cpuset), &cpuset))
    r = errno;
  else
    r = 0;
#else
  r = pthread_setaffinity_np(*tid, sizeof(cpuset), &cpuset);
#endif

  return UV__ERR(r);
}